

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_utf8.c
# Opt level: O2

int cm_utf8_is_valid(char *s)

{
  size_t sVar1;
  char *last;
  char *pcVar2;
  uint pc;
  uint local_24;
  
  if (s == (char *)0x0) {
    return 0;
  }
  sVar1 = strlen(s);
  last = s + sVar1;
  do {
    pcVar2 = last;
    if (s == last) break;
    s = cm_utf8_decode_character(s,last,&local_24);
    pcVar2 = (char *)0x0;
  } while (s != (char *)0x0);
  return (int)(pcVar2 == last);
}

Assistant:

int cm_utf8_is_valid(const char* s)
{
  if (!s) {
    return 0;
  }

  const char* last = s + strlen(s);
  const char* pos = s;
  unsigned int pc;

  while (pos != last && (pos = cm_utf8_decode_character(pos, last, &pc))) {
    /* Nothing to do. */
  }

  return pos == last;
}